

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O1

int spki_table_add_entry(spki_table *spki_table,spki_record *spki_record)

{
  pthread_rwlock_t *__rwlock;
  long lVar1;
  hash_cmp_fp p_Var2;
  tommy_list ptVar3;
  spki_update_fp p_Var4;
  uint uVar5;
  undefined8 uVar6;
  int iVar7;
  undefined8 *puVar8;
  tommy_list *pptVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint8_t *puVar13;
  undefined8 *puVar14;
  tommy_hashlin_node *ptVar15;
  tommy_node_struct *ptVar16;
  long in_FS_OFFSET;
  byte bVar17;
  spki_record in_stack_ffffffffffffff38;
  
  bVar17 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar8 = (undefined8 *)lrtr_malloc(0xc0);
  if (puVar8 == (undefined8 *)0x0) {
    iVar7 = -1;
  }
  else {
    *(uint32_t *)((long)puVar8 + 0x14) = spki_record->asn;
    puVar8[0xf] = spki_record->socket;
    *(undefined4 *)(puVar8 + 2) = *(undefined4 *)(spki_record->ski + 0x10);
    uVar6 = *(undefined8 *)(spki_record->ski + 8);
    *puVar8 = *(undefined8 *)spki_record->ski;
    puVar8[1] = uVar6;
    puVar13 = spki_record->spki;
    puVar14 = puVar8 + 3;
    for (lVar12 = 0xb; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar14 = *(undefined8 *)puVar13;
      puVar13 = puVar13 + (ulong)bVar17 * -0x10 + 8;
      puVar14 = puVar14 + (ulong)bVar17 * -2 + 1;
    }
    *(undefined2 *)(puVar8 + 0xe) = *(undefined2 *)(spki_record->spki + 0x58);
    *(uint8_t *)((long)puVar8 + 0x72) = spki_record->spki[0x5a];
    uVar10 = spki_record->asn * -0x3f;
    uVar10 = uVar10 >> 0x11 ^ uVar10;
    uVar10 = uVar10 * -0x1ff ^ uVar10 * -0x1ff0;
    uVar11 = uVar10 * -7 ^ uVar10 * -0x1c00;
    uVar11 = uVar11 >> 0xf ^ uVar11;
    __rwlock = &spki_table->lock;
    pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
    uVar10 = (spki_table->hashtable).low_mask & uVar11;
    if (uVar10 < (spki_table->hashtable).split) {
      uVar10 = (spki_table->hashtable).bucket_mask & uVar11;
    }
    uVar5 = 0x1f;
    if ((uVar10 | 1) != 0) {
      for (; (uVar10 | 1) >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    ptVar15 = (spki_table->hashtable).bucket[uVar5][uVar10];
    if (ptVar15 != (tommy_hashlin_node *)0x0) {
      p_Var2 = spki_table->cmp_fp;
      do {
        if (ptVar15->key == uVar11) {
          iVar7 = (*p_Var2)(puVar8,ptVar15->data);
          if (iVar7 == 0) {
            if (ptVar15->data != (void *)0x0) {
              lrtr_free(puVar8);
              pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
              iVar7 = -2;
              goto LAB_0010c58d;
            }
            break;
          }
        }
        ptVar15 = ptVar15->next;
      } while (ptVar15 != (tommy_node_struct *)0x0);
    }
    tommy_hashlin_insert(&spki_table->hashtable,(tommy_hashlin_node *)(puVar8 + 0x10),puVar8,uVar11)
    ;
    ptVar16 = (tommy_node_struct *)(puVar8 + 0x14);
    ptVar3 = spki_table->list;
    if (ptVar3 == (tommy_list)0x0) {
      pptVar9 = &spki_table->list;
      puVar8[0x15] = ptVar16;
      puVar8[0x14] = 0;
    }
    else {
      puVar8[0x15] = ptVar3->prev;
      ptVar3->prev = ptVar16;
      puVar8[0x14] = 0;
      pptVar9 = (tommy_list *)puVar8[0x15];
    }
    *pptVar9 = ptVar16;
    puVar8[0x16] = puVar8;
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    p_Var4 = spki_table->update_fp;
    iVar7 = 0;
    if (p_Var4 != (spki_update_fp)0x0) {
      puVar8 = (undefined8 *)&stack0xffffffffffffff38;
      for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
        *puVar8 = *(undefined8 *)spki_record->ski;
        spki_record = (spki_record *)((long)spki_record + (ulong)bVar17 * -0x10 + 8);
        puVar8 = puVar8 + (ulong)bVar17 * -2 + 1;
      }
      (*p_Var4)(spki_table,in_stack_ffffffffffffff38,true);
    }
  }
LAB_0010c58d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar7;
  }
  __stack_chk_fail();
}

Assistant:

int spki_table_add_entry(struct spki_table *spki_table, struct spki_record *spki_record)
{
	uint32_t hash;
	struct key_entry *entry;

	entry = lrtr_malloc(sizeof(*entry));
	if (!entry)
		return SPKI_ERROR;

	spki_record_to_key_entry(spki_record, entry);
	hash = tommy_inthash_u32(spki_record->asn);

	pthread_rwlock_wrlock(&spki_table->lock);
	if (tommy_hashlin_search(&spki_table->hashtable, spki_table->cmp_fp, entry, hash)) {
		lrtr_free(entry);
		pthread_rwlock_unlock(&spki_table->lock);
		return SPKI_DUPLICATE_RECORD;
	}

	/* Insert into hashtable and list */
	tommy_hashlin_insert(&spki_table->hashtable, &entry->hash_node, entry, hash);
	tommy_list_insert_tail(&spki_table->list, &entry->list_node, entry);
	pthread_rwlock_unlock(&spki_table->lock);
	spki_table_notify_clients(spki_table, spki_record, true);
	return SPKI_SUCCESS;
}